

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::NinjaOutputPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  bool bVar1;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  string *local_20;
  string *path_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_20 = path;
  path_local = (string *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  bVar1 = HasOutputPathPrefix(this);
  if ((!bVar1) || (bVar1 = cmsys::SystemTools::FileIsFullPath(local_20), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_50,&this->OutputPathPrefix);
    cmAlphaNum::cmAlphaNum(&local_80,local_20);
    cmStrCat<>(__return_storage_ptr__,&local_50,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::NinjaOutputPath(
  std::string const& path) const
{
  if (!this->HasOutputPathPrefix() || cmSystemTools::FileIsFullPath(path)) {
    return path;
  }
  return cmStrCat(this->OutputPathPrefix, path);
}